

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

BOOL __thiscall Memory::Recycler::Collect<(Memory::CollectionFlags)536920064>(Recycler *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined8 *in_FS_OFFSET;
  
  if ((this->collectionState).value == CollectionStateNotCollecting) {
    this->collectionWrapper->_isScriptContextCloseGCPending = 0;
    SetupPostCollectionFlags<(Memory::CollectionFlags)536920064>(this);
    this->hasIncompleteDoCollect = true;
    BVar4 = DoCollectWrapped(this,CollectNowForceInThreadExternalExhaustive);
    return BVar4;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  *puVar1 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                     ,0xec7,"((flags & CollectOverride_ForceInThread) == 0)",
                     "(flags & CollectOverride_ForceInThread) == 0");
  if (bVar3) {
    *puVar1 = 0;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xec8,"((flags & CollectMode_Concurrent) != 0)",
                       "(flags & CollectMode_Concurrent) != 0");
    if (bVar3) {
      *puVar1 = 0;
      BVar4 = TryFinishConcurrentCollect<(Memory::CollectionFlags)536920064>(this);
      return BVar4;
    }
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

BOOL
Recycler::Collect()
{
#if ENABLE_CONCURRENT_GC
    if (this->CollectionInProgress())
    {
        // If we are forced in thread, we can't be concurrent
        // If we are not concurrent we should have been handled before in CollectInternal and we shouldn't be here
        Assert((flags & CollectOverride_ForceInThread) == 0);
        Assert((flags & CollectMode_Concurrent) != 0);
        return TryFinishConcurrentCollect<flags>();
    }
#endif

    // We clear the flag indicating that there is a GC pending because
    // of script context close, since we're about to do a GC anyway,
    // since the current GC will suffice.
    this->collectionWrapper->ClearIsScriptContextCloseGCPending();

    SetupPostCollectionFlags<flags>();

    const BOOL partial = GetPartialFlag<flags>();
    CollectionFlags finalFlags = flags;
    if (!partial)
    {
        finalFlags = (CollectionFlags)(flags & ~CollectMode_Partial);
    }

    // ExecuteRecyclerCollectionFunction may cause exception. In which case, we may trigger the assert
    // in SetupPostCollectionFlags because we didn't reset the inExhausitvECollection variable if
    // an exception. Use this flag to disable it the assertion if exception occur
    DebugOnly(this->hasIncompleteDoCollect = true);

    {
        RECORD_TIMESTAMP(initialCollectionStartTime);
#ifdef NTBUILD
        this->telemetryBlock->initialCollectionStartProcessUsedBytes = PageAllocator::GetProcessUsedBytes();
        this->telemetryBlock->exhaustiveRepeatedCount = 0;
#endif

        return DoCollectWrapped(finalFlags);
    }
}